

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

bool __thiscall QMakeSourceFileInfo::mocable(QMakeSourceFileInfo *this,QString *file)

{
  SourceFiles *this_00;
  bool bVar1;
  SourceFile *pSVar2;
  long in_FS_OFFSET;
  QMakeLocalFileName local_60;
  QArrayData *local_30;
  char *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->files;
  local_60.real_name.d.d = (file->d).d;
  local_60.real_name.d.ptr = (file->d).ptr;
  local_60.real_name.d.size = (file->d).size;
  if (&(local_60.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_60.real_name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_60.real_name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_60.local_name.d.d = (Data *)0x0;
  local_60.local_name.d.ptr = (char16_t *)0x0;
  local_60.local_name.d.size = 0;
  QMakeLocalFileName::local(&local_60);
  QString::toLatin1_helper((QString *)&local_30);
  if (local_28 == (char *)0x0) {
    local_28 = (char *)&QByteArray::_empty;
  }
  pSVar2 = SourceFiles::lookupFile(this_00,local_28);
  if (local_30 != (QArrayData *)0x0) {
    LOCK();
    (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30,1,0x10);
    }
  }
  if (&(local_60.local_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_60.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_60.local_name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_60.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_60.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_60.real_name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pSVar2 == (SourceFile *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = (bool)(pSVar2->field_0x3c & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeSourceFileInfo::mocable(const QString &file)
{
    if(SourceFile *node = files->lookupFile(QMakeLocalFileName(file)))
        return node->mocable;
    return false;
}